

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

ByteCodeUsesInstr * __thiscall
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns
          (Inline *this,Instr *callInstr,Instr *funcObjCheckInsertInstr,
          FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,bool isBuiltIn,bool isCtor,
          bool isInlined)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  FixedFieldInfo *this_00;
  intptr_t iVar5;
  intptr_t iVar6;
  BailOutInstrTemplate<IR::Instr> *bailOutInstr_00;
  RegOpnd *funcOpnd;
  BailOutInstr *bailOutInstr;
  ByteCodeUsesInstr *pBStack_48;
  bool safeThis;
  ByteCodeUsesInstr *useCallTargetInstr;
  StackSym *pSStack_38;
  bool originalCallTargetIsJITOpt;
  StackSym *originalCallTargetStackSym;
  bool isInlined_local;
  bool isCtor_local;
  bool isBuiltIn_local;
  FunctionJITTimeInfo *pFStack_28;
  bool isPolymorphic_local;
  FunctionJITTimeInfo *inlineeInfo_local;
  Instr *funcObjCheckInsertInstr_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  originalCallTargetStackSym._5_1_ = isCtor;
  originalCallTargetStackSym._4_1_ = isInlined;
  originalCallTargetStackSym._6_1_ = isBuiltIn;
  originalCallTargetStackSym._7_1_ = isPolymorphic;
  pFStack_28 = inlineeInfo;
  inlineeInfo_local = (FunctionJITTimeInfo *)funcObjCheckInsertInstr;
  funcObjCheckInsertInstr_local = callInstr;
  callInstr_local = (Instr *)this;
  pOVar3 = IR::Instr::GetSrc1(callInstr);
  pSStack_38 = IR::Opnd::GetStackSym(pOVar3);
  pOVar3 = IR::Instr::GetSrc1(funcObjCheckInsertInstr_local);
  useCallTargetInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar3);
  pBStack_48 = (ByteCodeUsesInstr *)0x0;
  bailOutInstr._7_1_ = 0;
  bVar2 = TryOptimizeCallInstrWithFixedMethod
                    (this,funcObjCheckInsertInstr_local,pFStack_28,
                     (bool)(originalCallTargetStackSym._7_1_ & 1),
                     (bool)(originalCallTargetStackSym._6_1_ & 1),
                     (bool)(originalCallTargetStackSym._5_1_ & 1),
                     (bool)(originalCallTargetStackSym._4_1_ & 1),(bool *)((long)&bailOutInstr + 7),
                     false,0);
  if (bVar2) {
    if (funcObjCheckInsertInstr_local->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fc,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = IR::Instr::GetFixedFunction(funcObjCheckInsertInstr_local);
    iVar5 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr(pFStack_28);
    if (iVar5 != iVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fd,
                         "(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr())"
                         ,
                         "callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pBStack_48 = IR::ByteCodeUsesInstr::New(funcObjCheckInsertInstr_local);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (pBStack_48,(bool)(useCallTargetInstr._7_1_ & 1),(pSStack_38->super_Sym).m_id);
    IR::Instr::InsertBefore(funcObjCheckInsertInstr_local,&pBStack_48->super_Instr);
  }
  else {
    bailOutInstr_00 =
         IR::BailOutInstrTemplate<IR::Instr>::New
                   (BailOnNotBuiltIn,BailOutOnInlineFunction,funcObjCheckInsertInstr_local,
                    funcObjCheckInsertInstr_local->m_func);
    pOVar3 = IR::Instr::GetSrc1(funcObjCheckInsertInstr_local);
    funcOpnd = IR::Opnd::AsRegOpnd(pOVar3);
    InsertFunctionObjectCheck
              (this,funcOpnd,(Instr *)inlineeInfo_local,&bailOutInstr_00->super_Instr,pFStack_28);
  }
  return pBStack_48;
}

Assistant:

IR::ByteCodeUsesInstr*
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns(IR::Instr *callInstr, IR::Instr * funcObjCheckInsertInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined)
{
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr * useCallTargetInstr = nullptr;
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeInfo, isPolymorphic, isBuiltIn, isCtor, isInlined, safeThis))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        Assert(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr());
        // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after the last bailout before the call.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }
    else
    {
        IR::BailOutInstr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotBuiltIn, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
        InsertFunctionObjectCheck(callInstr->GetSrc1()->AsRegOpnd(), funcObjCheckInsertInstr, bailOutInstr, inlineeInfo);
    }
    return useCallTargetInstr;
}